

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperSTRCASENE
          (internal *this,char *s1_expression,char *s2_expression,char *s1,char *s2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  AssertionResult local_40;
  char *local_30;
  char *s2_local;
  char *s1_local;
  char *s2_expression_local;
  char *s1_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  local_30 = s2;
  s2_local = s1;
  s1_local = s2_expression;
  s2_expression_local = s1_expression;
  s1_expression_local = (char *)this;
  bVar1 = String::CaseInsensitiveCStringEquals(s1,s2);
  if (bVar1) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_40,(char (*) [12])"Expected: (");
    pAVar2 = AssertionResult::operator<<(pAVar2,&s2_expression_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
    pAVar2 = AssertionResult::operator<<(pAVar2,&s1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") (ignoring case), actual: \"");
    pAVar2 = AssertionResult::operator<<(pAVar2,&s2_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])"\" vs \"");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_30);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x160282);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    AssertionResult::~AssertionResult(&local_40);
    sVar3.ptr_ = extraout_RDX;
  }
  else {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperSTRCASENE(const char* s1_expression,
                                   const char* s2_expression,
                                   const char* s1,
                                   const char* s2) {
  if (!String::CaseInsensitiveCStringEquals(s1, s2)) {
    return AssertionSuccess();
  } else {
    return AssertionFailure()
        << "Expected: (" << s1_expression << ") != ("
        << s2_expression << ") (ignoring case), actual: \""
        << s1 << "\" vs \"" << s2 << "\"";
  }
}